

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hevcStreamReader.cpp
# Opt level: O2

void __thiscall
HEVCStreamReader::updateStreamFps
          (HEVCStreamReader *this,void *nalUnit,uint8_t *buff,uint8_t *nextNal,int param_4)

{
  uint8_t **ppuVar1;
  uint8_t *puVar2;
  int iVar3;
  int iVar4;
  uint8_t *dstBuffer;
  undefined4 *puVar5;
  uint *local_1e8;
  undefined8 local_1e0;
  uint local_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  uint *local_1c8;
  undefined8 local_1c0;
  uint local_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  ostringstream ss;
  
  this->m_vpsSizeDiff = 0;
  HevcVpsUnit::setFPS((HevcVpsUnit *)nalUnit,(this->super_MPEGStreamReader).m_fps);
  iVar3 = *(int *)((long)nalUnit + 0x10);
  dstBuffer = (uint8_t *)operator_new__((long)iVar3 + 0x10);
  iVar3 = HevcUnit::serializeBuffer((HevcUnit *)nalUnit,dstBuffer,dstBuffer + (long)iVar3 + 0x10);
  if (iVar3 == -1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    std::operator<<((ostream *)&ss,"Not enough buffer");
    puVar5 = (undefined4 *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    *puVar5 = 3;
    *(undefined4 **)(puVar5 + 2) = puVar5 + 6;
    if (local_1c8 == &local_1b8) {
      puVar5[6] = local_1b8;
      puVar5[7] = uStack_1b4;
      puVar5[8] = uStack_1b0;
      puVar5[9] = uStack_1ac;
    }
    else {
      *(uint **)(puVar5 + 2) = local_1c8;
      *(ulong *)(puVar5 + 6) = CONCAT44(uStack_1b4,local_1b8);
    }
    *(undefined8 *)(puVar5 + 4) = local_1c0;
    local_1c0 = 0;
    local_1b8 = local_1b8 & 0xffffff00;
    local_1c8 = &local_1b8;
    __cxa_throw(puVar5,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
  }
  puVar2 = (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd;
  iVar4 = iVar3 - ((int)nextNal - (int)buff);
  if (iVar4 != 0 && puVar2 != (uint8_t *)0x0) {
    this->m_vpsSizeDiff = iVar4;
    if ((this->super_MPEGStreamReader).m_tmpBuffer + 0x800000 < puVar2 + iVar4) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
      std::operator<<((ostream *)&ss,"Not enough buffer");
      puVar5 = (undefined4 *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      *puVar5 = 3;
      *(undefined4 **)(puVar5 + 2) = puVar5 + 6;
      if (local_1e8 == &local_1d8) {
        puVar5[6] = local_1d8;
        puVar5[7] = uStack_1d4;
        puVar5[8] = uStack_1d0;
        puVar5[9] = uStack_1cc;
      }
      else {
        *(uint **)(puVar5 + 2) = local_1e8;
        *(ulong *)(puVar5 + 6) = CONCAT44(uStack_1d4,local_1d8);
      }
      *(undefined8 *)(puVar5 + 4) = local_1e0;
      local_1d8 = local_1d8 & 0xffffff00;
      __cxa_throw(puVar5,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
    }
    memmove(nextNal + iVar4,nextNal,(long)puVar2 - (long)nextNal);
    ppuVar1 = &(this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd;
    *ppuVar1 = *ppuVar1 + this->m_vpsSizeDiff;
  }
  memcpy(buff,dstBuffer,(long)iVar3);
  operator_delete__(dstBuffer);
  return;
}

Assistant:

void HEVCStreamReader::updateStreamFps(void* nalUnit, uint8_t* buff, uint8_t* nextNal, int)
{
    const int oldNalSize = static_cast<int>(nextNal - buff);
    m_vpsSizeDiff = 0;
    const auto vps = static_cast<HevcVpsUnit*>(nalUnit);
    vps->setFPS(m_fps);
    const auto tmpBuffer = new uint8_t[vps->nalBufferLen() + 16];
    const int newSpsLen = vps->serializeBuffer(tmpBuffer, tmpBuffer + vps->nalBufferLen() + 16);
    if (newSpsLen == -1)
        THROW(ERR_COMMON, "Not enough buffer")

    if (m_bufEnd && newSpsLen != oldNalSize)
    {
        m_vpsSizeDiff = newSpsLen - oldNalSize;
        if (m_bufEnd + m_vpsSizeDiff > m_tmpBuffer + TMP_BUFFER_SIZE)
            THROW(ERR_COMMON, "Not enough buffer")
        memmove(nextNal + m_vpsSizeDiff, nextNal, m_bufEnd - nextNal);
        m_bufEnd += m_vpsSizeDiff;
    }
    memcpy(buff, tmpBuffer, newSpsLen);

    delete[] tmpBuffer;
}